

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O1

bool GatherInversionSyms(ParseNode *stmt,Symbol *outerVar,ParseNode *innerLoop,
                        ByteCodeGenerator *byteCodeGenerator,SymCheck *symCheck)

{
  Symbol *pSVar1;
  bool bVar2;
  ParseNodeBin *pPVar3;
  ParseNodeVar *pPVar4;
  ParseNodeName *pPVar5;
  long lVar6;
  ParseNodePtr this;
  Symbol *pSVar7;
  bool bVar8;
  
  if (stmt == (ParseNode *)0x0) {
    return true;
  }
  if (stmt->nop == knopVarDecl) {
    pPVar4 = ParseNode::AsParseNodeVar(stmt);
    pSVar7 = pPVar4->sym;
    this = (ParseNode *)0x0;
  }
  else {
    if (stmt->nop == knopAsg) {
      pPVar3 = ParseNode::AsParseNodeBin(stmt);
      this = pPVar3->pnode1;
    }
    else {
      this = (ParseNodePtr)0x0;
    }
    pSVar7 = (Symbol *)0x0;
  }
  if (this == (ParseNode *)0x0) {
LAB_008380b9:
    if (pSVar7 != (Symbol *)0x0) {
      lVar6 = (long)symCheck->symCount;
      bVar2 = lVar6 < 8;
      if (lVar6 < 8) {
        symCheck->symCount = symCheck->symCount + 1;
        symCheck->syms[lVar6] = pSVar7;
      }
      bVar8 = false;
      goto LAB_008380e1;
    }
    bVar8 = true;
  }
  else {
    if (this->nop != knopDot) {
      if (this->nop == knopName) {
        pPVar5 = ParseNode::AsParseNodeName(this);
        pSVar1 = pPVar5->sym;
        if (pSVar1 == (Symbol *)0x0) {
          bVar8 = false;
        }
        else {
          bVar8 = (pSVar1->field_0x42 & 8) == 0;
          if (bVar8) {
            pSVar7 = pSVar1;
          }
        }
        if (!bVar8) goto LAB_008380d9;
      }
      goto LAB_008380b9;
    }
LAB_008380d9:
    bVar8 = false;
  }
  bVar2 = false;
LAB_008380e1:
  if (bVar8) {
    return true;
  }
  return bVar2;
}

Assistant:

bool GatherInversionSyms(ParseNode* stmt, Symbol* outerVar, ParseNode* innerLoop, ByteCodeGenerator* byteCodeGenerator, SymCheck* symCheck)
{
    if (stmt != nullptr)
    {
        ParseNode* lhs = nullptr;
        Symbol* auxSym = nullptr;

        if (stmt->nop == knopAsg)
        {
            lhs = stmt->AsParseNodeBin()->pnode1;
        }
        else if (stmt->nop == knopVarDecl)
        {
            auxSym = stmt->AsParseNodeVar()->sym;
        }

        if (lhs != nullptr)
        {
            if (lhs->nop == knopDot)
            {
                return false;
            }

            if (lhs->nop == knopName)
            {
                ParseNodeName * pnodeNameLhs = lhs->AsParseNodeName();
                if ((pnodeNameLhs->sym == nullptr) || (pnodeNameLhs->sym->GetIsGlobal()))
                {
                    return false;
                }
                else
                {
                    auxSym = pnodeNameLhs->sym;
                }
            }
        }

        if (auxSym != nullptr)
        {
            return symCheck->AddSymbol(auxSym);
        }
    }

    return true;
}